

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_compress
               (uchar **out,size_t *outsize,uchar *in,size_t insize,
               LodePNGCompressSettings *settings)

{
  uint value;
  void *pvVar1;
  long *in_RSI;
  long *in_RDI;
  uint FCHECK;
  uint CMFFLG;
  uint FDICT;
  uint FLEVEL;
  uint CMF;
  uint ADLER32;
  size_t deflatesize;
  uchar *deflatedata;
  uint error;
  size_t i;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined1 *puVar2;
  uint local_34;
  undefined1 *local_30;
  
  puVar2 = (undefined1 *)0x0;
  local_34 = deflate((uchar **)0x0,
                     (size_t *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                     (uchar *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                     (LodePNGCompressSettings *)
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  *in_RDI = 0;
  *in_RSI = 0;
  if (local_34 == 0) {
    *in_RSI = (long)(puVar2 + 6);
    pvVar1 = lodepng_malloc(0x12799e);
    *in_RDI = (long)pvVar1;
    if (in_RDI == (long *)0x0) {
      local_34 = 0x53;
    }
  }
  if (local_34 == 0) {
    value = adler32((uchar *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                    in_stack_ffffffffffffff9c);
    *(undefined1 *)*in_RDI = 0x78;
    *(undefined1 *)(*in_RDI + 1) = 1;
    for (local_30 = (undefined1 *)0x0; local_30 != puVar2; local_30 = local_30 + 1) {
      local_30[*in_RDI + 2] = *local_30;
    }
    lodepng_set32bitInt((uchar *)(*in_RDI + *in_RSI + -4),value);
  }
  lodepng_free((void *)0x127aca);
  return local_34;
}

Assistant:

unsigned lodepng_zlib_compress(unsigned char** out, size_t* outsize, const unsigned char* in,
                               size_t insize, const LodePNGCompressSettings* settings) {
  size_t i;
  unsigned error;
  unsigned char* deflatedata = 0;
  size_t deflatesize = 0;

  error = deflate(&deflatedata, &deflatesize, in, insize, settings);

  *out = NULL;
  *outsize = 0;
  if(!error) {
    *outsize = deflatesize + 6;
    *out = (unsigned char*)lodepng_malloc(*outsize);
    if(!out) error = 83; /*alloc fail*/
  }

  if(!error) {
    unsigned ADLER32 = adler32(in, (unsigned)insize);
    /*zlib data: 1 byte CMF (CM+CINFO), 1 byte FLG, deflate data, 4 byte ADLER32 checksum of the Decompressed data*/
    unsigned CMF = 120; /*0b01111000: CM 8, CINFO 7. With CINFO 7, any window size up to 32768 can be used.*/
    unsigned FLEVEL = 0;
    unsigned FDICT = 0;
    unsigned CMFFLG = 256 * CMF + FDICT * 32 + FLEVEL * 64;
    unsigned FCHECK = 31 - CMFFLG % 31;
    CMFFLG += FCHECK;

    (*out)[0] = (unsigned char)(CMFFLG >> 8);
    (*out)[1] = (unsigned char)(CMFFLG & 255);
    for(i = 0; i != deflatesize; ++i) (*out)[i + 2] = deflatedata[i];
    lodepng_set32bitInt(&(*out)[*outsize - 4], ADLER32);
  }

  lodepng_free(deflatedata);
  return error;
}